

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmu-hash32.c
# Opt level: O3

void ppc_hash32_set_r(PowerPCCPU_conflict3 *cpu,hwaddr pte_offset,uint32_t pte1)

{
  address_space_stb_ppc64
            ((cpu->env).uc,(cpu->parent_obj).as,
             pte_offset + (ulong)*(ushort *)((long)(cpu->env).spr + 0xca) * 0x10000 + 6,
             pte1 >> 8 & 0xff | 1,(MemTxAttrs)0x1,(MemTxResult *)0x0);
  return;
}

Assistant:

static void ppc_hash32_set_r(PowerPCCPU *cpu, hwaddr pte_offset, uint32_t pte1)
{
    target_ulong base = ppc_hash32_hpt_base(cpu);
    hwaddr offset = pte_offset + 6;

    /* The HW performs a non-atomic byte update */
#ifdef UNICORN_ARCH_POSTFIX
    glue(stb_phys, UNICORN_ARCH_POSTFIX)(cpu->env.uc, CPU(cpu)->as, base + offset, ((pte1 >> 8) & 0xff) | 0x01);
#else
    stb_phys(cpu->env.uc, CPU(cpu)->as, base + offset, ((pte1 >> 8) & 0xff) | 0x01);
#endif
}